

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_server_connection.c
# Opt level: O3

void socket_disconnected_notification(void *arg)

{
  apx_socketServerConnection_t *self;
  
  if (arg == (void *)0x0) {
    return;
  }
  if (*(long *)((long)arg + 0x428) != 0) {
    apx_server_detach_connection(*(long *)((long)arg + 0x428),arg);
    return;
  }
  __assert_fail("self->base.parent != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/extension/socket_server_connection.c"
                ,0x116,"void socket_disconnected_notification(void *)");
}

Assistant:

static void socket_disconnected_notification(void* arg)
{
   apx_socketServerConnection_t* self = (apx_socketServerConnection_t*)arg;
#if APX_DEBUG_ENABLE
   printf("[SERVER-SOCKET] Client disconnected\n");
#endif
   if (self != NULL)
   {
      assert(self->base.parent != NULL);
      apx_server_detach_connection(self->base.parent, &self->base);
   }
}